

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch.cpp
# Opt level: O3

int __thiscall asmjit::ArchInfo::init(ArchInfo *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  ulong uVar2;
  uint8_t in_DL;
  
  uVar2 = 0;
  if ((uint)ctx < 6) {
    uVar2 = (ulong)ctx & 0xffffffff;
  }
  uVar1 = (&archInfoTable)[uVar2];
  (this->field_0)._signature = uVar1;
  if ((uint)uVar2 == (uVar1 & 0xff)) {
    (this->field_0).field_0._type = (uint8_t)ctx;
    (this->field_0).field_0._subType = in_DL;
    return (uint)uVar2;
  }
  init((EVP_PKEY_CTX *)this);
}

Assistant:

ASMJIT_FAVOR_SIZE void ArchInfo::init(uint32_t type, uint32_t subType) noexcept {
  uint32_t index = type < ASMJIT_ARRAY_SIZE(archInfoTable) ? type : uint32_t(0);

  // Make sure the `archInfoTable` array is correctly indexed.
  _signature = archInfoTable[index];
  ASMJIT_ASSERT(_type == index);

  // Even if the architecture is not known we setup its type and sub-type,
  // however, such architecture is not really useful.
  _type = type;
  _subType = subType;
}